

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O1

char * uprv_getDefaultLocaleID_63(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  char *__dest;
  char *pcVar5;
  char *__s;
  
  if (uprv_getPOSIXIDForDefaultLocale()::posixID == (char *)0x0) {
    pcVar2 = setlocale(5,(char *)0x0);
    if ((((pcVar2 == (char *)0x0) || (iVar1 = strcmp("C",pcVar2), iVar1 == 0)) ||
        (iVar1 = strcmp("POSIX",pcVar2), iVar1 == 0)) &&
       ((pcVar2 = getenv("LC_ALL"), pcVar2 == (char *)0x0 &&
        (pcVar2 = getenv("LC_MESSAGES"), pcVar2 == (char *)0x0)))) {
      pcVar2 = getenv("LANG");
    }
    if (((pcVar2 == (char *)0x0) || (iVar1 = strcmp("C",pcVar2), iVar1 == 0)) ||
       (iVar1 = strcmp("POSIX",pcVar2), uprv_getPOSIXIDForDefaultLocale()::posixID = pcVar2,
       iVar1 == 0)) {
      uprv_getPOSIXIDForDefaultLocale()::posixID = "en_US_POSIX";
    }
  }
  pcVar2 = uprv_getPOSIXIDForDefaultLocale()::posixID;
  if (gCorrectedPOSIXLocale != (char *)0x0) {
    return gCorrectedPOSIXLocale;
  }
  pcVar3 = strchr(uprv_getPOSIXIDForDefaultLocale()::posixID,0x2e);
  if (pcVar3 == (char *)0x0) {
    __dest = (char *)0x0;
LAB_0029c9c8:
    pcVar3 = strrchr(pcVar2,0x40);
    if (pcVar3 != (char *)0x0) {
      if (__dest == (char *)0x0) {
        sVar4 = strlen(pcVar2);
        __dest = (char *)uprv_malloc_63(sVar4 + 2);
        if (__dest == (char *)0x0) goto LAB_0029cb1d;
        strncpy(__dest,pcVar2,(long)pcVar3 - (long)pcVar2);
        __dest[(long)pcVar3 - (long)pcVar2] = '\0';
      }
      iVar1 = strcmp(pcVar3 + 1,"nynorsk");
      __s = "NY";
      if (iVar1 != 0) {
        __s = pcVar3 + 1;
      }
      pcVar3 = strchr(__dest,0x5f);
      sVar4 = strlen(__dest);
      pcVar5 = __dest + sVar4;
      if (pcVar3 == (char *)0x0) {
        pcVar5[2] = '\0';
        pcVar5[0] = '_';
        pcVar5[1] = '_';
      }
      else {
        pcVar5[0] = '_';
        pcVar5[1] = '\0';
      }
      pcVar3 = strchr(__s,0x2e);
      if (pcVar3 == (char *)0x0) {
        strcat(__dest,__s);
      }
      else {
        sVar4 = strlen(__dest);
        strncat(__dest,__s,(long)pcVar3 - (long)__s);
        __dest[(int)sVar4 + (int)((long)pcVar3 - (long)__s)] = '\0';
      }
    }
    if (__dest == (char *)0x0) {
      sVar4 = strlen(pcVar2);
      __dest = (char *)uprv_malloc_63(sVar4 + 1);
      if (__dest == (char *)0x0) goto LAB_0029cb1d;
      strcpy(__dest,pcVar2);
    }
    pcVar2 = __dest;
    if (gCorrectedPOSIXLocale == (char *)0x0) {
      gCorrectedPOSIXLocaleHeapAllocated = 1;
      gCorrectedPOSIXLocale = __dest;
      ucln_common_registerCleanup_63(UCLN_COMMON_PUTIL,putil_cleanup);
      pcVar2 = (char *)0x0;
    }
    if (pcVar2 != (char *)0x0) {
      uprv_free_63(pcVar2);
    }
  }
  else {
    sVar4 = strlen(pcVar2);
    __dest = (char *)uprv_malloc_63(sVar4 + 1);
    if (__dest != (char *)0x0) {
      strncpy(__dest,pcVar2,(long)pcVar3 - (long)pcVar2);
      __dest[(long)pcVar3 - (long)pcVar2] = '\0';
      pcVar3 = strchr(__dest,0x40);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
      }
      goto LAB_0029c9c8;
    }
LAB_0029cb1d:
    __dest = (char *)0x0;
  }
  return __dest;
}

Assistant:

static const char *uprv_getPOSIXIDForDefaultLocale(void)
{
    static const char* posixID = NULL;
    if (posixID == 0) {
        posixID = uprv_getPOSIXIDForCategory(LC_MESSAGES);
    }
    return posixID;
}